

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaValidateFile(xmlSchemaValidCtxtPtr ctxt,char *filename,int options)

{
  xmlParserCtxtPtr pctxt_00;
  xmlParserCtxtPtr pctxt;
  int ret;
  int options_local;
  char *filename_local;
  xmlSchemaValidCtxtPtr ctxt_local;
  
  if ((ctxt == (xmlSchemaValidCtxtPtr)0x0) || (filename == (char *)0x0)) {
    ctxt_local._4_4_ = -1;
  }
  else {
    pctxt_00 = xmlCreateURLParserCtxt(filename,0);
    if (pctxt_00 == (xmlParserCtxtPtr)0x0) {
      ctxt_local._4_4_ = -1;
    }
    else {
      (*xmlFree)(pctxt_00->sax);
      pctxt_00->sax = (_xmlSAXHandler *)0x0;
      ctxt_local._4_4_ = xmlSchemaValidateStreamInternal(ctxt,pctxt_00);
      xmlFreeParserCtxt(pctxt_00);
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlSchemaValidateFile(xmlSchemaValidCtxtPtr ctxt,
                      const char * filename,
		      int options ATTRIBUTE_UNUSED)
{
    int ret;
    xmlParserCtxtPtr pctxt = NULL;

    if ((ctxt == NULL) || (filename == NULL))
        return (-1);

    pctxt = xmlCreateURLParserCtxt(filename, 0);
    if (pctxt == NULL)
	return (-1);
    /* We really want pctxt->sax to be NULL here. */
    xmlFree(pctxt->sax);
    pctxt->sax = NULL;
    ret = xmlSchemaValidateStreamInternal(ctxt, pctxt);
    xmlFreeParserCtxt(pctxt);
    return (ret);
}